

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

string * __thiscall
util::make_string<char_const(&)[21],CylHead&,char_const(&)[6]>
          (string *__return_storage_ptr__,util *this,char (*args) [21],CylHead *args_1,
          char (*args_2) [6])

{
  ostringstream ss;
  ostringstream local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::operator<<((ostream *)local_1a0,(char *)this);
  ::operator<<((ostream *)local_1a0,(CylHead *)args);
  std::operator<<((ostream *)local_1a0,(char *)args_1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string make_string(Args&& ... args)
{
    std::ostringstream ss;
    (void)std::initializer_list<bool> {(ss << args, false)...};
    return ss.str();
}